

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall ctemplate::BaseArena::FreeBlocks(BaseArena *this)

{
  AllocatedBlock *pAVar1;
  _Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *this_00;
  long lVar2;
  pointer pAVar3;
  
  pAVar1 = this->first_blocks_;
  for (lVar2 = 1; pAVar1 = pAVar1 + 1, lVar2 < this->blocks_alloced_; lVar2 = lVar2 + 1) {
    free(pAVar1->mem);
    pAVar1->mem = (char *)0x0;
    pAVar1->size = 0;
  }
  this->blocks_alloced_ = 1;
  this_00 = &this->overflow_blocks_->
             super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  ;
  if (this_00 !=
      (_Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
       *)0x0) {
    for (pAVar3 = (((_Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                     *)&this_00->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
        pAVar3 != (this_00->_M_impl).super__Vector_impl_data._M_finish; pAVar3 = pAVar3 + 1) {
      free(pAVar3->mem);
      this_00 = &this->overflow_blocks_->
                 super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
      ;
    }
    std::
    _Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
    ::~_Vector_base(this_00);
    operator_delete(this_00);
    this->overflow_blocks_ =
         (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
          *)0x0;
  }
  return;
}

Assistant:

void BaseArena::FreeBlocks() {
  for ( int i = 1; i < blocks_alloced_; ++i ) {  // keep first block alloced
    free(first_blocks_[i].mem);
    first_blocks_[i].mem = NULL;
    first_blocks_[i].size = 0;
  }
  blocks_alloced_ = 1;
  if (overflow_blocks_ != NULL) {
    vector<AllocatedBlock>::iterator it;
    for (it = overflow_blocks_->begin(); it != overflow_blocks_->end(); ++it) {
      free(it->mem);
    }
    delete overflow_blocks_;             // These should be used very rarely
    overflow_blocks_ = NULL;
  }
}